

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::SetStencilOp
          (GLContextState *this,GLenum Face,STENCIL_OP StencilFailOp,STENCIL_OP StencilDepthFailOp,
          STENCIL_OP StencilPassOp)

{
  GLenum GVar1;
  GLenum GVar2;
  Char *Message;
  uint uVar3;
  undefined1 local_50 [8];
  string msg;
  GLenum err;
  GLenum dppass;
  GLenum dpfail;
  GLenum glsfail;
  StencilOpState *FaceStencilOp;
  STENCIL_OP StencilPassOp_local;
  STENCIL_OP StencilDepthFailOp_local;
  STENCIL_OP StencilFailOp_local;
  GLenum Face_local;
  GLContextState *this_local;
  
  uVar3 = (uint)(Face != 0x404);
  if ((((this->m_DSState).m_StencilOpState[(int)uVar3].StencilFailOp != StencilFailOp) ||
      ((this->m_DSState).m_StencilOpState[(int)uVar3].StencilDepthFailOp != StencilDepthFailOp)) ||
     ((this->m_DSState).m_StencilOpState[(int)uVar3].StencilPassOp != StencilPassOp)) {
    GVar1 = StencilOp2GlStencilOp(StencilFailOp);
    GVar2 = StencilOp2GlStencilOp(StencilDepthFailOp);
    msg.field_2._12_4_ = StencilOp2GlStencilOp(StencilPassOp);
    (*__glewStencilOpSeparate)(Face,GVar1,GVar2,msg.field_2._12_4_);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[32],char[17],unsigned_int>
                (false,"SetStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x239,(char (*) [32])"Failed to set stencil operation",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_50,(char (*) [6])0x4585f6);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SetStencilOp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x239);
      std::__cxx11::string::~string((string *)local_50);
    }
    (this->m_DSState).m_StencilOpState[(int)uVar3].StencilFailOp = StencilFailOp;
    (this->m_DSState).m_StencilOpState[(int)uVar3].StencilDepthFailOp = StencilDepthFailOp;
    (this->m_DSState).m_StencilOpState[(int)uVar3].StencilPassOp = StencilPassOp;
  }
  return;
}

Assistant:

void GLContextState::SetStencilOp(GLenum Face, STENCIL_OP StencilFailOp, STENCIL_OP StencilDepthFailOp, STENCIL_OP StencilPassOp)
{
    DepthStencilGLState::StencilOpState& FaceStencilOp = m_DSState.m_StencilOpState[Face == GL_FRONT ? 0 : 1];
    if (FaceStencilOp.StencilFailOp != StencilFailOp ||
        FaceStencilOp.StencilDepthFailOp != StencilDepthFailOp ||
        FaceStencilOp.StencilPassOp != StencilPassOp)
    {
        GLenum glsfail = StencilOp2GlStencilOp(StencilFailOp);
        GLenum dpfail  = StencilOp2GlStencilOp(StencilDepthFailOp);
        GLenum dppass  = StencilOp2GlStencilOp(StencilPassOp);

        glStencilOpSeparate(Face, glsfail, dpfail, dppass);
        DEV_CHECK_GL_ERROR("Failed to set stencil operation");

        FaceStencilOp.StencilFailOp      = StencilFailOp;
        FaceStencilOp.StencilDepthFailOp = StencilDepthFailOp;
        FaceStencilOp.StencilPassOp      = StencilPassOp;
    }
}